

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O2

void am_translate_coord_to_me(Am_Object *in_obj,Am_Object *ref_obj,int *x,int *y)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object owner;
  Am_Object local_28;
  
  bVar1 = Am_Object::operator==(ref_obj,in_obj);
  if (!bVar1) {
    owner.data = (Am_Object_Data *)0x0;
    Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)in_obj);
    Am_Object::operator=(&owner,&local_28);
    Am_Object::~Am_Object(&local_28);
    bVar1 = Am_Object::Valid(&owner);
    if ((bVar1) && (bVar1 = Am_Object::operator==(&owner,ref_obj), bVar1)) {
      pAVar3 = Am_Object::Get(in_obj,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      *x = *x - iVar2;
      pAVar3 = Am_Object::Get(in_obj,0x65,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      *y = *y - iVar2;
    }
    else {
      Am_Translate_Coordinates(ref_obj,*x,*y,in_obj,x,y);
    }
    Am_Object::~Am_Object(&owner);
    return;
  }
  return;
}

Assistant:

void
am_translate_coord_to_me(Am_Object in_obj, Am_Object ref_obj, int &x, int &y)
{
  if (ref_obj == in_obj) {
    return; //x, y are already OK
  } else {
    Am_Object owner;
    owner = in_obj.Get_Owner();
    if (owner.Valid() && owner == ref_obj) { // cheap transformation
      x -= (int)in_obj.Get(Am_LEFT); //simple translate coords to the inside
      y -= (int)in_obj.Get(Am_TOP);  // of object
    } else //not the owner, use expensive transformation
      Am_Translate_Coordinates(ref_obj, x, y, in_obj, x, y);
  }
}